

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aligned-mem-pool.h
# Opt level: O2

void * __thiscall cnn::AlignedMemoryPool<6U>::allocate(AlignedMemoryPool<6U> *this,size_t n)

{
  size_t sVar1;
  ulong uVar2;
  
  sVar1 = this->used;
  uVar2 = ((ulong)((n & 0x3f) != 0) * 0x40 + n & 0xffffffffffffffc0) + sVar1;
  if (uVar2 <= this->capacity) {
    this->used = uVar2;
    return (void *)(sVar1 + (long)this->mem);
  }
  std::operator<<((ostream *)&std::cerr,"cnn is out of memory, try increasing with --cnn-mem\n");
  abort();
}

Assistant:

inline static size_t round_up_align(size_t n) {
    if (AlignedBits < 2) return n;
    auto c = (n & ((1 << (AlignedBits)) - 1)) > 0 ? 1 : 0;
    return ((n >> (AlignedBits)) + c) << (AlignedBits);
  }